

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O2

N_Vector ManyVectorClone(N_Vector w,int cloneempty)

{
  long *plVar1;
  N_Vector p_Var2;
  long *plVar3;
  void *pvVar4;
  long lVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  
  p_Var2 = (N_Vector)N_VNewEmpty(w->sunctx);
  N_VCopyOps(w,p_Var2);
  plVar3 = (long *)malloc(0x20);
  p_Var2->content = plVar3;
  plVar1 = (long *)w->content;
  lVar7 = *plVar1;
  lVar8 = plVar1[1];
  *plVar3 = *plVar1;
  plVar3[1] = lVar8;
  *(undefined4 *)(plVar3 + 3) = 1;
  pvVar4 = malloc(lVar7 * 8);
  plVar3[2] = (long)pvVar4;
  lVar5 = 0;
  lVar8 = 0;
  if (0 < lVar7) {
    lVar8 = lVar7;
  }
  for (; lVar8 != lVar5; lVar5 = lVar5 + 1) {
    *(undefined8 *)(plVar3[2] + lVar5 * 8) = 0;
  }
  for (lVar8 = 0; lVar8 < lVar7; lVar8 = lVar8 + 1) {
    if (cloneempty == 0) {
      uVar6 = N_VClone(*(undefined8 *)(*(long *)((long)w->content + 0x10) + lVar8 * 8));
    }
    else {
      uVar6 = N_VCloneEmpty();
    }
    *(undefined8 *)(plVar3[2] + lVar8 * 8) = uVar6;
    lVar7 = *plVar3;
  }
  return p_Var2;
}

Assistant:

static N_Vector ManyVectorClone(N_Vector w, sunbooleantype cloneempty)
{
  SUNFunctionBegin(w->sunctx);
  N_Vector v;
  MVAPPEND(N_VectorContent) content;
  sunindextype i;

  /* Create vector */
  v = NULL;
  v = N_VNewEmpty(w->sunctx);
  SUNCheckLastErrNull();

  /* Attach operations */
  SUNCheckCallNull(N_VCopyOps(w, v));

  /* Create content */
  content = NULL;
  content = (MVAPPEND(N_VectorContent))malloc(sizeof *content);
  SUNAssertNull(content, SUN_ERR_MALLOC_FAIL);

  /* Attach content and ops to new vector, and return */
  v->content = content;

  /* Attach content components */

  /* Set scalar components */
#ifdef MANYVECTOR_BUILD_WITH_MPI
  content->comm = MPI_COMM_NULL;
#endif
  content->num_subvectors = MANYVECTOR_NUM_SUBVECS(w);
  content->global_length  = MANYVECTOR_GLOBLENGTH(w);
  content->own_data       = SUNTRUE;

  /* Allocate the subvector array */
  content->subvec_array = NULL;
  content->subvec_array =
    (N_Vector*)malloc(content->num_subvectors * sizeof(N_Vector));
  SUNAssertNull(content->subvec_array, SUN_ERR_MALLOC_FAIL);

  /* Initialize the subvector array to NULL */
  for (i = 0; i < content->num_subvectors; i++)
  {
    content->subvec_array[i] = NULL;
  }

  /* Duplicate the input communicator (if applicable) */
#ifdef MANYVECTOR_BUILD_WITH_MPI
  if (MANYVECTOR_COMM(w) != MPI_COMM_NULL)
  {
    SUNCheckMPICallNull(MPI_Comm_dup(MANYVECTOR_COMM(w), &(content->comm)));
  }
#endif

  /* Clone vectors into the subvector array */
  for (i = 0; i < content->num_subvectors; i++)
  {
    if (cloneempty)
    {
      content->subvec_array[i] = N_VCloneEmpty(MANYVECTOR_SUBVEC(w, i));
      SUNCheckLastErrNull();
    }
    else
    {
      content->subvec_array[i] = N_VClone(MANYVECTOR_SUBVEC(w, i));
      SUNCheckLastErrNull();
    }
  }

  return (v);
}